

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_set.h
# Opt level: O3

size_t __thiscall
spvtools::EnumSet<spvtools::Extension>::erase(EnumSet<spvtools::Extension> *this,Extension *value)

{
  pointer __src;
  Extension EVar1;
  size_t sVar2;
  ulong uVar3;
  pointer pBVar4;
  pointer pBVar5;
  
  sVar2 = FindBucketForValue(this,*value);
  pBVar5 = (this->buckets_).
           super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar4 = (this->buckets_).
           super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (sVar2 < (ulong)((long)pBVar4 - (long)pBVar5 >> 4)) {
    EVar1 = *value;
    if (pBVar5[sVar2].start == (EVar1 & ~kSPV_INTEL_masked_gather_scatter)) {
      pBVar5 = pBVar5 + sVar2;
      uVar3 = pBVar5->data;
      if ((uVar3 >> ((ulong)EVar1 & 0x3f) & 1) != 0) {
        this->size_ = this->size_ - 1;
        uVar3 = uVar3 & ~(1L << ((byte)EVar1 & 0x3f));
        pBVar5->data = uVar3;
        if (uVar3 != 0) {
          return 1;
        }
        __src = pBVar5 + 1;
        if (__src != pBVar4) {
          memmove(pBVar5,__src,(long)pBVar4 - (long)__src);
          pBVar4 = (this->buckets_).
                   super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        (this->buckets_).
        super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
        ._M_impl.super__Vector_impl_data._M_finish = pBVar4 + -1;
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

size_t erase(const T& value) {
    const size_t index = FindBucketForValue(value);
    if (index >= buckets_.size() ||
        buckets_[index].start != ComputeBucketStart(value)) {
      return 0;
    }

    auto& bucket = buckets_[index];
    const auto mask = ComputeMaskForValue(value);
    if (!(bucket.data & mask)) {
      return 0;
    }

    size_ -= 1;
    bucket.data &= ~mask;
    if (bucket.data == 0) {
      buckets_.erase(buckets_.cbegin() + index);
    }
    return 1;
  }